

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateContextTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::egl::CreateContextNoConfigCase::iterate(CreateContextNoConfigCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  deUint32 err;
  Library *egl;
  EGLDisplay pvVar5;
  size_t sVar6;
  undefined4 extraout_var;
  char *pcVar8;
  TestError *this_00;
  NotSupportedError *this_01;
  long lVar9;
  UniqueDisplay display;
  Enum<int,_2UL> local_1d0;
  UniqueDisplay local_1c0;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  GetNameFunc p_Var7;
  
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pvVar5 = eglu::getAndInitDisplay
                     ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                      super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                      .m_data.ptr,(Version *)0x0);
  eglu::UniqueDisplay::UniqueDisplay(&local_1c0,egl,pvVar5);
  pvVar5 = local_1c0.m_display;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1b0 = (undefined1  [8])local_1a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b0,"EGL_KHR_no_config_context","");
  bVar2 = eglu::hasExtension(egl,pvVar5,(string *)local_1b0);
  if (local_1b0 != (undefined1  [8])local_1a0) {
    operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
  }
  if (!bVar2) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"EGL_KHR_no_config_context is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextTests.cpp"
               ,0x81);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "pass");
  lVar9 = 0;
  do {
    iVar4 = *(int *)((long)&DAT_02111968 + lVar9);
    iVar3 = (**egl->_vptr_Library)(egl);
    if (iVar3 == 0) {
      iVar3 = (*egl->_vptr_Library[0x1f])(egl);
      if (iVar3 != 0x300c) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,(char *)0x0,"egl.getError() == EGL_BAD_PARAMETER",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextTests.cpp"
                   ,0x8b);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      local_1b0 = (undefined1  [8])paVar1;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"eglBindAPI(",0xb);
      local_1d0.m_getName = eglu::getAPIName;
      local_1d0.m_value = iVar4;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,") failed, skipping",0x12);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00e4e676:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    else {
      local_1b0 = (undefined1  [8])paVar1;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Creating ",9);
      pcVar8 = *(char **)((long)&s_apis + lVar9);
      if (pcVar8 == (char *)0x0) {
        std::ios::clear((int)local_1a8[-3] + (int)(ostringstream *)&local_1a8);
      }
      else {
        sVar6 = strlen(pcVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar8,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," context",8);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      iVar4 = (*egl->_vptr_Library[6])
                        (egl,local_1c0.m_display,0,0,*(undefined8 *)((long)&DAT_02111970 + lVar9));
      p_Var7 = (GetNameFunc)CONCAT44(extraout_var,iVar4);
      iVar4 = (*egl->_vptr_Library[0x1f])(egl);
      if (p_Var7 != (GetNameFunc)0x0 && iVar4 == 0x3000) {
        (*egl->_vptr_Library[0x13])(egl,local_1c0.m_display,p_Var7);
        err = (*egl->_vptr_Library[0x1f])(egl);
        eglu::checkError(err,"destroyContext(*display, context)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextTests.cpp"
                         ,0x9d);
        local_1b0 = (undefined1  [8])paVar1;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"  Pass",6);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_00e4e676;
      }
      local_1b0 = (undefined1  [8])paVar1;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"  Fail, context: ",0x11);
      local_1d0.m_getName = p_Var7;
      tcu::Format::Hex<16UL>::toStream((Hex<16UL> *)&local_1d0,(ostream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", error: ",9);
      pcVar8 = eglu::getErrorName(iVar4);
      if (pcVar8 == (char *)0x0) {
        std::ios::clear((int)local_1a8[-3] + (int)(ostringstream *)&local_1a8);
      }
      else {
        sVar6 = strlen(pcVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar8,sVar6);
      }
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Failed to create context");
    }
    lVar9 = lVar9 + 0x18;
    if (lVar9 == 0x78) {
      eglu::UniqueDisplay::~UniqueDisplay(&local_1c0);
      return STOP;
    }
  } while( true );
}

Assistant:

IterateResult iterate (void)
	{
		const eglw::Library&		egl		= m_eglTestCtx.getLibrary();
		const eglu::UniqueDisplay	display	(egl, eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay(), DE_NULL));
		tcu::TestLog&				log		= m_testCtx.getLog();

		if (!eglu::hasExtension(egl, *display, "EGL_KHR_no_config_context"))
			TCU_THROW(NotSupportedError, "EGL_KHR_no_config_context is not supported");

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "pass");

		for (int apiNdx = 0; apiNdx < (int)DE_LENGTH_OF_ARRAY(s_apis); apiNdx++)
		{
			const EGLenum	api		= s_apis[apiNdx].api;

			if (egl.bindAPI(api) == EGL_FALSE)
			{
				TCU_CHECK(egl.getError() == EGL_BAD_PARAMETER);
				log << TestLog::Message << "eglBindAPI(" << eglu::getAPIStr(api) << ") failed, skipping" << TestLog::EndMessage;
				continue;
			}

			log << TestLog::Message << "Creating " << s_apis[apiNdx].name << " context" << TestLog::EndMessage;

			const EGLContext	context = egl.createContext(*display, (EGLConfig)0, EGL_NO_CONTEXT, s_apis[apiNdx].ctxAttrs);
			const EGLenum		err		= egl.getError();

			if (context == EGL_NO_CONTEXT || err != EGL_SUCCESS)
			{
				log << TestLog::Message << "  Fail, context: " << tcu::toHex(context) << ", error: " << eglu::getErrorName(err) << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Failed to create context");
			}
			else
			{
				// Destroy
				EGLU_CHECK_CALL(egl, destroyContext(*display, context));
				log << TestLog::Message << "  Pass" << TestLog::EndMessage;
			}
		}

		return STOP;
	}